

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingQtWriter.cpp
# Opt level: O0

QRect * ZXingQt::WriteBarcode(QStringView text,BarcodeFormat format)

{
  int iVar1;
  int iVar2;
  int iVar3;
  value_t *pvVar4;
  BarcodeFormat in_ECX;
  QRect *in_RDI;
  Matrix<unsigned_char> bitmap;
  BitMatrix matrix;
  MultiFormatWriter writer;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QString *this;
  uchar in_stack_ffffffffffffff26;
  uchar in_stack_ffffffffffffff27;
  BitMatrix *in_stack_ffffffffffffff28;
  QImage local_d0 [24];
  Matrix<unsigned_char> local_b8;
  QString local_88;
  string local_70 [32];
  string local_50 [36];
  MultiFormatWriter local_2c [2];
  
  ZXing::MultiFormatWriter::MultiFormatWriter(local_2c,in_ECX);
  this = &local_88;
  QStringView::toString
            ((QStringView *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QString::toStdString_abi_cxx11_(this);
  ZXing::MultiFormatWriter::encode(local_50,(int)local_2c,(int)local_70);
  std::__cxx11::string::~string(local_70);
  QString::~QString((QString *)0x1033f4);
  ZXing::ToMatrix<unsigned_char>
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff27,in_stack_ffffffffffffff26);
  pvVar4 = ZXing::Matrix<unsigned_char>::data((Matrix<unsigned_char> *)0x103419);
  iVar1 = ZXing::Matrix<unsigned_char>::width(&local_b8);
  iVar2 = ZXing::Matrix<unsigned_char>::height(&local_b8);
  iVar3 = ZXing::Matrix<unsigned_char>::width(&local_b8);
  QImage::QImage(local_d0,pvVar4,iVar1,iVar2,(long)iVar3,Format_Grayscale8,
                 (_func_void_void_ptr *)0x0,(void *)0x0);
  QRect::QRect((QRect *)&stack0xffffffffffffff20);
  QImage::copy(in_RDI);
  QImage::~QImage(local_d0);
  ZXing::Matrix<unsigned_char>::~Matrix((Matrix<unsigned_char> *)0x1034c1);
  ZXing::BitMatrix::~BitMatrix((BitMatrix *)0x1034ce);
  return in_RDI;
}

Assistant:

QImage WriteBarcode(QStringView text, ZXing::BarcodeFormat format)
{
	using namespace ZXing;

#ifdef ZXING_EXPERIMENTAL_API
	auto barcode = CreateBarcodeFromText(text.toString().toStdString(), format);
	auto bitmap = WriteBarcodeToImage(barcode);
#else
	auto writer = MultiFormatWriter(format);
	auto matrix = writer.encode(text.toString().toStdString(), 0, 0);
	auto bitmap = ToMatrix<uint8_t>(matrix);
#endif
	return QImage(bitmap.data(), bitmap.width(), bitmap.height(), bitmap.width(), QImage::Format::Format_Grayscale8).copy();
}